

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_client.cc
# Opt level: O1

void __thiscall iqxmlrpc::Https_client_connection::recv_succeed(Https_client_connection *this)

{
  size_t in_RCX;
  size_t in_RDX;
  bool *in_RSI;
  
  recv_succeed((Https_client_connection *)
               &this[-1].super_Reaction_connection.super_Connection.super_Connection.sock.sock,
               in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

void Https_client_connection::recv_succeed( bool&, size_t, size_t sz )
{
  if( !sz )
    throw iqnet::network_error( "Connection closed by peer.", false );

  std::string s( read_buf(), sz );
  resp_packet = read_response( s );

  if( !resp_packet )
  {
    reg_recv( read_buf(), read_buf_sz() );
  }
}